

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Tools::ReadAllFilesInDir_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Tools *this)

{
  bool bVar1;
  char *__s;
  path *this_00;
  string_type local_120;
  string local_100;
  directory_entry *local_e0;
  directory_entry *entry;
  undefined1 local_c8 [8];
  directory_iterator __end1;
  undefined1 local_a8 [8];
  directory_iterator __begin1;
  allocator<char> local_81;
  string_type local_80;
  path local_60;
  directory_iterator local_38;
  directory_iterator *local_28;
  directory_iterator *__range1;
  Tools *local_18;
  Tools *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filess;
  
  __range1._7_1_ = 0;
  local_18 = this;
  this_local = (Tools *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  __s = (char *)std::__cxx11::string::data();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_81);
  std::filesystem::__cxx11::path::path(&local_60,&local_80,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator(&local_38,&local_60);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  local_28 = &local_38;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount,local_28);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_a8,(directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&entry,local_28);
  std::filesystem::__cxx11::end((directory_iterator *)local_c8);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)&entry);
  while (bVar1 = std::filesystem::__cxx11::operator!=
                           ((directory_iterator *)local_a8,(directory_iterator *)local_c8), bVar1) {
    local_e0 = (directory_entry *)
               std::filesystem::__cxx11::directory_iterator::operator*
                         ((directory_iterator *)local_a8);
    this_00 = std::filesystem::__cxx11::directory_entry::path(local_e0);
    std::filesystem::__cxx11::path::operator_cast_to_string(&local_120,this_00);
    CutPathString(&local_100,this,&local_120);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_a8);
  }
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_c8);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_a8);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_38);
  return __return_storage_ptr__;
}

Assistant:

vector<string> ReadAllFilesInDir() {
        vector<string> filess;
        for (const auto &entry : fs::directory_iterator(string(this->path->data()))) {
            filess.push_back(this->CutPathString(entry.path()));
        }
        return filess;
    }